

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseTerm(Parser *this)

{
  Mark MVar1;
  TokenType type;
  Mark *pMVar2;
  Token *pTVar3;
  Tokenizer *in_RSI;
  Token identifierToken;
  istream *local_140;
  undefined1 local_138 [48];
  Token token;
  _Optional_payload_base<Token> local_d0;
  Token local_90;
  Token local_58;
  
  pMVar2 = Stream::getMark(&in_RSI->stream_);
  MVar1 = *pMVar2;
  pTVar3 = Tokenizer::peek(in_RSI);
  Token::Token(&token,pTVar3);
  if (token.type == Identifier) {
LAB_00131207:
    Token::Token(&identifierToken,&token);
    Tokenizer::nextToken((Token *)&local_140,in_RSI);
    Token::operator=(&token,(Token *)&local_140);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)local_138);
    if (token.type == LParen) {
      std::_Optional_payload_base<Token>::_Optional_payload_base<Token_const&>
                (&local_d0,&identifierToken);
      parseFunctionCall(this,(optional<Token> *)in_RSI);
      std::_Optional_payload_base<Token>::_M_reset(&local_d0);
    }
    else {
      std::get<0ul,std::__cxx11::string,double>(&identifierToken.value);
      std::make_unique<VariableNode,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140);
      *(Mark *)(local_140 + 8) = MVar1;
      (this->tokenizer_).stream_.is_ = local_140;
    }
    pTVar3 = &identifierToken;
  }
  else {
    if (token.type == Number) {
      Tokenizer::nextToken(&local_58,in_RSI);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_58.value);
      std::get<1ul,std::__cxx11::string,double>(&token.value);
      std::make_unique<NumericLiteralNode,double&>((double *)&identifierToken);
      *(Mark *)(identifierToken._0_8_ + 8) = MVar1;
      (this->tokenizer_).stream_.is_ = (istream *)identifierToken._0_8_;
      goto LAB_001312a2;
    }
    if (token.type - KeywordIf < 2) goto LAB_00131207;
    if (token.type != LParen) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&identifierToken,"Expected number, identifier of function call!",
                 (allocator<char> *)&local_140);
      reportError((Parser *)in_RSI,(string *)&identifierToken);
    }
    Tokenizer::nextToken(&identifierToken,in_RSI);
    Token::operator=(&token,&identifierToken);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&identifierToken.value);
    if (token.type == Backslash) {
      parseLambdaCall(this,SUB81(in_RSI,0));
      goto LAB_001312a2;
    }
    parseLogicalExpression(this);
    pTVar3 = Tokenizer::peek(in_RSI);
    if (pTVar3->type != RParen) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&identifierToken,"Expected closing parenthesis!",
                 (allocator<char> *)&local_140);
      reportError((Parser *)in_RSI,(string *)&identifierToken);
    }
    Tokenizer::nextToken(&local_90,in_RSI);
    pTVar3 = &local_90;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)&pTVar3->value);
LAB_001312a2:
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)&token.value);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseTerm()
{
  const auto mark = tokenizer_.getMark();
  auto token = tokenizer_.peek();
  if(token.type == TokenType::Number)
  {
    tokenizer_.nextToken();
    auto node = std::make_unique<NumericLiteralNode>(std::get<double>(token.value));
    node->setMark(mark);
    return node;
  }
  else if(token.type == TokenType::Identifier || Token::isSpecialFunction(token))
  {
    const auto identifierToken = token;
    token = tokenizer_.nextToken();
    if(token.type == TokenType::LParen)
      return parseFunctionCall(identifierToken);
    else
    {
      auto node = std::make_unique<VariableNode>(std::get<std::string>(identifierToken.value));
      node->setMark(mark);
      return node;
    }
  }
  else if(token.type == TokenType::LParen)
  {
    token = tokenizer_.nextToken();
    if(token.type == TokenType::Backslash)
      return parseLambdaCall(true);

    auto expr = parseLogicalExpression();
    if(tokenizer_.peek().type == TokenType::RParen)
    {
      tokenizer_.nextToken();
      return expr;
    }
    else
      reportError("Expected closing parenthesis!");
  }
  else
    reportError("Expected number, identifier of function call!");

  return nullptr;
}